

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::detail::generic_type::dealloc
               (instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *self)

{
  PyTypeObject *pPVar1;
  PyObject *op;
  bool bVar2;
  internals *piVar3;
  pointer ppVar4;
  undefined8 *puVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  pVar6;
  PyObject *_py_tmp;
  PyObject **dict_ptr;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> local_40;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> it;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> _Stack_30;
  bool found;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  range;
  unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *registered_instances;
  PyTypeObject *instance_type;
  instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *self_local;
  
  if ((self->super_instance_essentials<void>).value != (void *)0x0) {
    pPVar1 = (self->super_instance_essentials<void>).ob_base.ob_type;
    piVar3 = get_internals();
    range.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)
         &piVar3->registered_instances;
    pVar6 = std::
            unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
            ::equal_range((unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                           *)range.second.
                             super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
                             _M_cur,&(self->super_instance_essentials<void>).value);
    it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur._7_1_ = 0;
    _Stack_30 = pVar6.first.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
                _M_cur;
    local_40 = _Stack_30.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
               _M_cur;
    while (bVar2 = std::__detail::operator!=
                             (&local_40,
                              (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)
                              &range), bVar2) {
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)
                          &local_40);
      if (pPVar1 == *(PyTypeObject **)((long)ppVar4->second + 8)) {
        std::
        unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
        ::erase((unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                 *)range.second.
                   super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur,
                (iterator)local_40._M_cur);
        it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur._7_1_ = 1;
        break;
      }
      std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)&local_40);
    }
    if ((it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur._7_1_ & 1)
        == 0) {
      pybind11_fail("generic_type::dealloc(): Tried to deallocate unregistered instance!");
    }
    if ((self->super_instance_essentials<void>).weakrefs != (PyObject *)0x0) {
      PyObject_ClearWeakRefs(self);
    }
    puVar5 = (undefined8 *)_PyObject_GetDictPtr(self);
    if ((puVar5 != (undefined8 *)0x0) && (op = (PyObject *)*puVar5, op != (PyObject *)0x0)) {
      *puVar5 = 0;
      _Py_DECREF(op);
    }
  }
  (*((self->super_instance_essentials<void>).ob_base.ob_type)->tp_free)(self);
  return;
}

Assistant:

static void dealloc(instance<void> *self) {
        if (self->value) {
            auto instance_type = Py_TYPE(self);
            auto &registered_instances = detail::get_internals().registered_instances;
            auto range = registered_instances.equal_range(self->value);
            bool found = false;
            for (auto it = range.first; it != range.second; ++it) {
                if (instance_type == Py_TYPE(it->second)) {
                    registered_instances.erase(it);
                    found = true;
                    break;
                }
            }
            if (!found)
                pybind11_fail("generic_type::dealloc(): Tried to deallocate unregistered instance!");

            if (self->weakrefs)
                PyObject_ClearWeakRefs((PyObject *) self);

            PyObject **dict_ptr = _PyObject_GetDictPtr((PyObject *) self);
            if (dict_ptr)
                Py_CLEAR(*dict_ptr);
        }
        Py_TYPE(self)->tp_free((PyObject*) self);
    }